

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall kratos::Generator::wire(Generator *this,Var *left,Var *right)

{
  undefined8 uVar1;
  shared_ptr<kratos::AssignStmt> sVar2;
  undefined1 local_38 [24];
  pointer local_20;
  
  sVar2 = Var::assign((Var *)local_38,left);
  uVar1 = local_38._0_8_;
  local_38._16_8_ = local_38._0_8_;
  local_20 = (pointer)local_38._8_8_;
  local_38._0_8_ = (_func_int **)0x0;
  local_38._8_8_ = (pointer)0x0;
  (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar1)->
               _M_dataplus)._M_p + 0x38))
            (uVar1,this,
             sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
  emplace_back<std::shared_ptr<kratos::Stmt>>
            ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *)
             &this->stmts_,(shared_ptr<kratos::Stmt> *)(local_38 + 0x10));
  if (local_20 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  if ((pointer)local_38._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  return;
}

Assistant:

void Generator::wire(Var &left, Var &right) { add_stmt(left.assign(right)); }